

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall wasm::WATParser::anon_unknown_0::LexIntCtx::takeSign(LexIntCtx *this)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  LexIntCtx *this_local;
  
  bVar2 = sv("+",1);
  bVar1 = LexCtx::takePrefix(&this->super_LexCtx,bVar2);
  if (bVar1) {
    this->sign = Pos;
  }
  else {
    bVar2 = sv("-",1);
    bVar1 = LexCtx::takePrefix(&this->super_LexCtx,bVar2);
    if (bVar1) {
      this->sign = Neg;
    }
    else {
      this->sign = NoSign;
    }
  }
  return;
}

Assistant:

void takeSign() {
    if (takePrefix("+"sv)) {
      sign = Pos;
    } else if (takePrefix("-"sv)) {
      sign = Neg;
    } else {
      sign = NoSign;
    }
  }